

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

int Fl_Plugin_Manager::loadAll(char *filepath,char *pattern)

{
  dirent *__ptr;
  Name __ptr_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  dirent **dir;
  Name local_40;
  dirent **local_38;
  
  uVar1 = fl_filename_list(filepath,&local_38,fl_numericsort);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      __ptr = local_38[uVar3];
      if (pattern == (char *)0x0) {
LAB_001c6747:
        Fl_Preferences::Name::Name(&local_40,"%s%s",filepath,__ptr->d_name);
        __ptr_00.data_ = local_40.data_;
        dlopen(local_40.data_,1);
        if (__ptr_00.data_ != (char *)0x0) {
          free(__ptr_00.data_);
          local_40.data_ = (char *)0x0;
        }
      }
      else {
        iVar2 = fl_filename_match(__ptr->d_name,pattern);
        if (iVar2 != 0) goto LAB_001c6747;
      }
      free(__ptr);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  free(local_38);
  return 0;
}

Assistant:

int Fl_Plugin_Manager::loadAll(const char *filepath, const char *pattern) {
  struct dirent **dir;
  int i, n = fl_filename_list(filepath, &dir);
  for (i=0; i<n; i++) {
    struct dirent *e = dir[i];
    if (pattern==0 || fl_filename_match(e->d_name, pattern)) {
      load(Fl_Preferences::Name("%s%s", filepath, e->d_name));
    }
    free(e);
  }
  free(dir);
  return 0;
}